

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O3

size_t asio::detail::
       write_buffer_sequence<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t>
                 (long s,long *buffers,undefined8 param_3,error_code *param_4)

{
  ulong uVar1;
  long lVar2;
  error_category *peVar3;
  ulong uVar4;
  size_t sVar5;
  size_t offset;
  
  peVar3 = (error_category *)std::_V2::system_category();
  param_4->_M_value = 0;
  param_4->_M_cat = peVar3;
  uVar1 = buffers[1];
  if (uVar1 == 0) {
    uVar4 = 0;
  }
  else {
    lVar2 = *buffers;
    uVar4 = 0;
    do {
      sVar5 = uVar1 - uVar4;
      if (0xffff < sVar5) {
        sVar5 = 0x10000;
      }
      sVar5 = socket_ops::sync_send1
                        (*(socket_type *)(s + 8),*(state_type *)(s + 0xc),(void *)(lVar2 + uVar4),
                         sVar5,0,param_4);
      uVar4 = sVar5 + uVar4;
    } while ((uVar4 < uVar1) && (param_4->_M_value == 0));
  }
  return uVar4;
}

Assistant:

std::size_t write_buffer_sequence(SyncWriteStream& s,
      const ConstBufferSequence& buffers, const ConstBufferIterator&,
      CompletionCondition completion_condition, asio::error_code& ec)
  {
    ec = asio::error_code();
    asio::detail::consuming_buffers<const_buffer,
        ConstBufferSequence, ConstBufferIterator> tmp(buffers);
    while (!tmp.empty())
    {
      if (std::size_t max_size = detail::adapt_completion_condition_result(
            completion_condition(ec, tmp.total_consumed())))
        tmp.consume(s.write_some(tmp.prepare(max_size), ec));
      else
        break;
    }
    return tmp.total_consumed();;
  }